

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O0

void __thiscall VPath::VPathData::addPath(VPathData *this,VPathData *path,VMatrix *m)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  __normal_iterator<const_VPointF_*,_std::vector<VPointF,_std::allocator<VPointF>_>_> __last;
  back_insert_iterator<std::vector<VPath::Element,_std::allocator<VPath::Element>_>_> __result;
  long in_RDX;
  VPathData *in_RSI;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *in_RDI;
  VPointF *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VPointF,_std::allocator<VPointF>_> *__range2;
  size_t segment;
  value_type *in_stack_ffffffffffffff28;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *in_stack_ffffffffffffff30;
  __normal_iterator<const_VPointF_*,_std::vector<VPointF,_std::allocator<VPointF>_>_>
  in_stack_ffffffffffffff58;
  __normal_iterator<const_VPointF_*,_std::vector<VPointF,_std::allocator<VPointF>_>_> local_30;
  VPathData *local_28;
  size_t local_20;
  long local_18;
  VPathData *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = segments(in_RSI);
  sVar2 = std::vector<VPointF,_std::allocator<VPointF>_>::capacity
                    ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI);
  sVar3 = std::vector<VPointF,_std::allocator<VPointF>_>::size
                    ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI);
  sVar4 = std::vector<VPointF,_std::allocator<VPointF>_>::size(&local_10->m_points);
  if (sVar2 < sVar3 + sVar4) {
    in_stack_ffffffffffffff58._M_current =
         (VPointF *)
         std::vector<VPointF,_std::allocator<VPointF>_>::size
                   ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI);
    std::vector<VPointF,_std::allocator<VPointF>_>::size(&local_10->m_points);
    std::vector<VPointF,_std::allocator<VPointF>_>::reserve
              ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI,
               (size_type)in_stack_ffffffffffffff58._M_current);
  }
  __last._M_current =
       (VPointF *)std::vector<VPath::Element,_std::allocator<VPath::Element>_>::capacity(in_RDI + 1)
  ;
  __result.container =
       (vector<VPath::Element,_std::allocator<VPath::Element>_> *)
       std::vector<VPath::Element,_std::allocator<VPath::Element>_>::size(in_RDI + 1);
  sVar2 = std::vector<VPath::Element,_std::allocator<VPath::Element>_>::size(&local_10->m_elements);
  if (__last._M_current <
      (VPointF *)
      ((long)&(((_Vector_base<VPointF,_std::allocator<VPointF>_> *)
               &(__result.container)->
                super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>)->_M_impl).
              super__Vector_impl_data._M_start + sVar2)) {
    std::vector<VPath::Element,_std::allocator<VPath::Element>_>::size(in_RDI + 1);
    std::vector<VPath::Element,_std::allocator<VPath::Element>_>::size(&local_10->m_elements);
    std::vector<VPath::Element,_std::allocator<VPath::Element>_>::reserve
              (in_RDI,(size_type)in_stack_ffffffffffffff58._M_current);
  }
  if (local_18 == 0) {
    std::vector<VPointF,_std::allocator<VPointF>_>::begin
              ((vector<VPointF,_std::allocator<VPointF>_> *)in_stack_ffffffffffffff28);
    std::vector<VPointF,_std::allocator<VPointF>_>::end
              ((vector<VPointF,_std::allocator<VPointF>_> *)in_stack_ffffffffffffff28);
    std::back_inserter<std::vector<VPointF,std::allocator<VPointF>>>
              ((vector<VPointF,_std::allocator<VPointF>_> *)in_stack_ffffffffffffff28);
    std::
    copy<__gnu_cxx::__normal_iterator<VPointF_const*,std::vector<VPointF,std::allocator<VPointF>>>,std::back_insert_iterator<std::vector<VPointF,std::allocator<VPointF>>>>
              (in_stack_ffffffffffffff58,__last,
               (back_insert_iterator<std::vector<VPointF,_std::allocator<VPointF>_>_>)
               __result.container);
  }
  else {
    local_28 = local_10;
    local_30._M_current =
         (VPointF *)
         std::vector<VPointF,_std::allocator<VPointF>_>::begin
                   ((vector<VPointF,_std::allocator<VPointF>_> *)in_stack_ffffffffffffff28);
    std::vector<VPointF,_std::allocator<VPointF>_>::end
              ((vector<VPointF,_std::allocator<VPointF>_> *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_VPointF_*,_std::vector<VPointF,_std::allocator<VPointF>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<const_VPointF_*,_std::vector<VPointF,_std::allocator<VPointF>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      in_stack_ffffffffffffff30 = in_RDI;
      __gnu_cxx::__normal_iterator<const_VPointF_*,_std::vector<VPointF,_std::allocator<VPointF>_>_>
      ::operator*(&local_30);
      in_RDI = in_stack_ffffffffffffff30;
      VMatrix::map((VMatrix *)in_stack_ffffffffffffff58._M_current,__last._M_current);
      std::vector<VPointF,_std::allocator<VPointF>_>::push_back
                ((vector<VPointF,_std::allocator<VPointF>_> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
      __gnu_cxx::__normal_iterator<const_VPointF_*,_std::vector<VPointF,_std::allocator<VPointF>_>_>
      ::operator++(&local_30);
    }
  }
  std::vector<VPath::Element,_std::allocator<VPath::Element>_>::begin
            ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)in_stack_ffffffffffffff28);
  std::vector<VPath::Element,_std::allocator<VPath::Element>_>::end
            ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)in_stack_ffffffffffffff28);
  std::back_inserter<std::vector<VPath::Element,std::allocator<VPath::Element>>>
            ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)in_stack_ffffffffffffff28);
  std::
  copy<__gnu_cxx::__normal_iterator<VPath::Element_const*,std::vector<VPath::Element,std::allocator<VPath::Element>>>,std::back_insert_iterator<std::vector<VPath::Element,std::allocator<VPath::Element>>>>
            ((__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
              )in_stack_ffffffffffffff58._M_current,
             (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
              )__last._M_current,__result);
  (((_Vector_base<VPointF,_std::allocator<VPointF>_> *)
   &in_RDI[2].super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>)->_M_impl).
  super__Vector_impl_data._M_start =
       (pointer)((long)&((((_Vector_base<VPointF,_std::allocator<VPointF>_> *)
                          &in_RDI[2].
                           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>)->
                         _M_impl).super__Vector_impl_data._M_start)->mx + local_20);
  *(undefined1 *)
   ((long)&(((_Vector_base<VPointF,_std::allocator<VPointF>_> *)
            &in_RDI[2].super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>)->_M_impl
           ).super__Vector_impl_data._M_end_of_storage + 4) = 1;
  return;
}

Assistant:

void VPath::VPathData::addPath(const VPathData &path, const VMatrix *m)
{
    size_t segment = path.segments();

    // make sure enough memory available
    if (m_points.capacity() < m_points.size() + path.m_points.size())
        m_points.reserve(m_points.size() + path.m_points.size());

    if (m_elements.capacity() < m_elements.size() + path.m_elements.size())
        m_elements.reserve(m_elements.size() + path.m_elements.size());

    if (m) {
        for (const auto &i : path.m_points) {
            m_points.push_back(m->map(i));
        }
    } else {
        std::copy(path.m_points.begin(), path.m_points.end(),
                  back_inserter(m_points));
    }

    std::copy(path.m_elements.begin(), path.m_elements.end(),
              back_inserter(m_elements));

    m_segments += segment;
    mLengthDirty = true;
}